

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O2

void abgr_f32_to_abgr_8888
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  uint *puVar1;
  float *pfVar2;
  int iVar3;
  uint *puVar4;
  long lVar5;
  
  lVar5 = (long)width;
  pfVar2 = (float *)((long)src + (long)(sy * src_pitch) + (long)sx * 0x10);
  iVar3 = 0;
  if (height < 1) {
    height = 0;
  }
  puVar4 = (uint *)((long)dst + (long)dx * 4 + (long)(dy * dst_pitch));
  for (; iVar3 != height; iVar3 = iVar3 + 1) {
    puVar1 = puVar4 + lVar5;
    for (; puVar4 < puVar1; puVar4 = puVar4 + 1) {
      *puVar4 = (uint)(long)(*pfVar2 * 255.0) | (int)(long)(pfVar2[1] * 255.0) << 8 |
                (int)(long)(pfVar2[2] * 255.0) << 0x10 | (int)(long)(pfVar2[3] * 255.0) << 0x18;
      pfVar2 = pfVar2 + 4;
    }
    pfVar2 = pfVar2 + lVar5 * -4 + (long)(src_pitch / 0x10) * 4;
    puVar4 = puVar4 + (dst_pitch / 4 - lVar5);
  }
  return;
}

Assistant:

static void abgr_f32_to_abgr_8888(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const ALLEGRO_COLOR *src_ptr = (const ALLEGRO_COLOR *)((const char *)src + sy * src_pitch);
   uint32_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 16 - width;
   int dst_gap = dst_pitch / 4 - width;
   src_ptr += sx;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint32_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         *dst_ptr = ALLEGRO_CONVERT_ABGR_F32_TO_ABGR_8888(*src_ptr);
         dst_ptr++;
         src_ptr++;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}